

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

bool __thiscall pbrt::SampledWavelengths::SecondaryTerminated(SampledWavelengths *this)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 1;
  while (uVar3 = uVar2, uVar3 != 4) {
    fVar1 = (this->pdf).values[uVar3];
    if ((fVar1 != 0.0) || (uVar2 = uVar3 + 1, NAN(fVar1))) break;
  }
  return 3 < uVar3;
}

Assistant:

PBRT_CPU_GPU
    bool SecondaryTerminated() const {
        for (int i = 1; i < NSpectrumSamples; ++i)
            if (pdf[i] != 0)
                return false;
        return true;
    }